

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

any cs_impl::any::make_constant<int,__11>(anon_enum_32 *args)

{
  holder<int> *args_1;
  proxy *dat;
  allocator_type<cs_impl::any::proxy,_512UL,_cs_impl::default_allocator_provider> *in_RSI;
  proxy *in_RDI;
  proxy *args_2;
  allocator_type<cs_impl::any::holder<int>,_64UL,_cs_impl::default_allocator_provider>
  *in_stack_ffffffffffffffe0;
  undefined4 uVar1;
  undefined4 uVar2;
  
  uVar2 = 2;
  uVar1 = 1;
  args_2 = in_RDI;
  args_1 = cs::allocator_type<cs_impl::any::holder<int>,64ul,cs_impl::default_allocator_provider>::
           alloc<__11>(in_stack_ffffffffffffffe0,(anon_enum_32 *)in_RDI);
  dat = cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
        alloc<int,int,cs_impl::any::holder<int>*>
                  (in_RSI,(int *)CONCAT44(uVar2,uVar1),(int *)args_1,(holder<int> **)args_2);
  any((any *)in_RDI,dat);
  return (any)args_2;
}

Assistant:

static any make_constant(ArgsT &&...args)
		{
			return any(allocator.alloc(2, 1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}